

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O3

void Abc_SclObjMarkFanFans(Abc_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  uint uVar1;
  int iVar2;
  void **ppvVar3;
  
  if ((pObj->field_0x14 & 0x20) == 0) {
    uVar1 = vNodes->nSize;
    if (uVar1 == vNodes->nCap) {
      if ((int)uVar1 < 0x10) {
        if (vNodes->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc(0x80);
        }
        else {
          ppvVar3 = (void **)realloc(vNodes->pArray,0x80);
        }
        vNodes->pArray = ppvVar3;
        vNodes->nCap = 0x10;
      }
      else {
        if (vNodes->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar3 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
        }
        vNodes->pArray = ppvVar3;
        vNodes->nCap = uVar1 * 2;
      }
    }
    else {
      ppvVar3 = vNodes->pArray;
    }
    iVar2 = vNodes->nSize;
    vNodes->nSize = iVar2 + 1;
    ppvVar3[iVar2] = pObj;
    pObj->field_0x14 = pObj->field_0x14 | 0x20;
  }
  return;
}

Assistant:

void Abc_SclObjMarkFanFans( Abc_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
//    Abc_Obj_t * pNext;
//    int i;
    if ( pObj->fMarkB == 0 )
    {
        Vec_PtrPush( vNodes, pObj );
        pObj->fMarkB = 1;
    }
/*
    Abc_ObjForEachFanin( pObj, pNext, i )
        if ( pNext->fMarkB == 0 )
        {
            Vec_PtrPush( vNodes, pNext );
            pNext->fMarkB = 1;
        }
    Abc_ObjForEachFanout( pObj, pNext, i )
        if ( pNext->fMarkB == 0 )
        {
            Vec_PtrPush( vNodes, pNext );
            pNext->fMarkB = 1;
        }
*/
}